

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall
Assimp::ASEImporter::AddNodes
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes,
          aiNode *pcParent,char *szName,aiMatrix4x4 *mat)

{
  value_type this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  reference ppBVar4;
  size_t sVar5;
  char *__s2;
  aiNode *paVar6;
  long lVar7;
  void *pvVar8;
  Logger *this_01;
  size_type sVar9;
  ulong uVar10;
  aiNode **ppaVar11;
  reference ppaVar12;
  char *local_1b8;
  size_t local_190;
  uint local_17c;
  undefined1 local_178 [4];
  uint p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  uint local_134;
  undefined1 local_130 [4];
  uint m;
  aiNode *local_110;
  aiNode *nd;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 auStack_c8 [8];
  aiMatrix4x4 mParentAdjust;
  aiNode *node;
  aiNode *local_70;
  BaseNode *local_68;
  BaseNode *snode;
  const_iterator end;
  const_iterator it;
  vector<aiNode_*,_std::allocator<aiNode_*>_> apcNodes;
  size_t len;
  aiMatrix4x4 *mat_local;
  char *szName_local;
  aiNode *pcParent_local;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes_local;
  ASEImporter *this_local;
  
  if (szName == (char *)0x0) {
    local_190 = 0;
  }
  else {
    local_190 = strlen(szName);
  }
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it);
  end = std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::begin(nodes)
  ;
  snode = (BaseNode *)
          std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::end(nodes)
  ;
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                             *)&snode);
    if (!bVar2) {
      sVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                        ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it);
      pcParent->mNumChildren = (uint)sVar9;
      if (pcParent->mNumChildren != 0) {
        sVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                          ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = sVar9 + 1;
        uVar10 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        ppaVar11 = (aiNode **)operator_new__(uVar10);
        pcParent->mChildren = ppaVar11;
        for (local_17c = 0;
            sVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it),
            local_17c < sVar9; local_17c = local_17c + 1) {
          ppaVar12 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[]
                               ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it,(ulong)local_17c)
          ;
          pcParent->mChildren[local_17c] = *ppaVar12;
        }
      }
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
                ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it);
      return;
    }
    ppBVar4 = __gnu_cxx::
              __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
              ::operator*(&end);
    local_68 = *ppBVar4;
    if (szName == (char *)0x0) {
      lVar7 = std::__cxx11::string::length();
      if (lVar7 == 0) {
LAB_005b79dd:
        ppBVar4 = __gnu_cxx::
                  __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                  ::operator*(&end);
        (*ppBVar4)->mProcessed = true;
        paVar6 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar6);
        local_70 = paVar6;
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it,&local_70);
        ppaVar12 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::back
                             ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it);
        this_00 = *ppaVar12;
        mParentAdjust._56_8_ = this_00;
        lVar7 = std::__cxx11::string::length();
        if (lVar7 == 0) {
          local_1b8 = "Unnamed_Node";
        }
        else {
          local_1b8 = (char *)std::__cxx11::string::c_str();
        }
        aiString::Set(&this_00->mName,local_1b8);
        *(aiNode **)(mParentAdjust._56_8_ + 0x448) = pcParent;
        auStack_c8._0_4_ = mat->a1;
        auStack_c8._4_4_ = mat->a2;
        mParentAdjust.a1 = mat->a3;
        mParentAdjust.a2 = mat->a4;
        mParentAdjust.a3 = mat->b1;
        mParentAdjust.a4 = mat->b2;
        mParentAdjust.b1 = mat->b3;
        mParentAdjust.b2 = mat->b4;
        mParentAdjust.b3 = mat->c1;
        mParentAdjust.b4 = mat->c2;
        mParentAdjust.c1 = mat->c3;
        mParentAdjust.c2 = mat->c4;
        mParentAdjust.c3 = mat->d1;
        mParentAdjust.c4 = mat->d2;
        mParentAdjust.d1 = mat->d3;
        mParentAdjust.d2 = mat->d4;
        aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)auStack_c8);
        aiMatrix4x4t<float>::operator*
                  ((aiMatrix4x4t<float> *)&nd,(aiMatrix4x4t<float> *)auStack_c8,
                   &local_68->mTransform);
        *(undefined8 *)(mParentAdjust._56_8_ + 0x434) = local_d8;
        *(undefined8 *)(mParentAdjust._56_8_ + 0x43c) = uStack_d0;
        *(undefined8 *)(mParentAdjust._56_8_ + 0x424) = local_e8;
        *(undefined8 *)(mParentAdjust._56_8_ + 0x42c) = uStack_e0;
        *(undefined8 *)(mParentAdjust._56_8_ + 0x414) = local_f8;
        *(undefined8 *)(mParentAdjust._56_8_ + 0x41c) = uStack_f0;
        *(aiNode **)(mParentAdjust._56_8_ + 0x404) = nd;
        *(undefined8 *)(mParentAdjust._56_8_ + 0x40c) = uStack_100;
        bVar2 = aiString::operator!=
                          ((aiString *)mParentAdjust._56_8_,
                           *(aiString **)(mParentAdjust._56_8_ + 0x448));
        if ((bVar2) &&
           (bVar2 = aiString::operator!=
                              ((aiString *)mParentAdjust._56_8_,
                               *(aiString **)(*(long *)(mParentAdjust._56_8_ + 0x448) + 0x448)),
           bVar2)) {
          AddNodes(this,nodes,(aiNode *)mParentAdjust._56_8_,(char *)(mParentAdjust._56_8_ + 4),
                   &local_68->mTransform);
        }
        if (local_68->mType == Mesh) {
          AddMeshes(this,local_68,(aiNode *)mParentAdjust._56_8_);
        }
        else {
          bVar2 = is_not_qnan<float>((local_68->mTargetPosition).x);
          if (bVar2) {
            if (*(int *)(mParentAdjust._56_8_ + 0x450) == 0) {
              pvVar8 = operator_new__(8);
              *(void **)(mParentAdjust._56_8_ + 0x458) = pvVar8;
            }
            paVar6 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar6);
            local_110 = paVar6;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_130,&local_68->mName,".Target");
            aiString::Set((aiString *)paVar6,(string *)local_130);
            std::__cxx11::string::~string((string *)local_130);
            (local_110->mTransformation).a4 =
                 (local_68->mTargetPosition).x - (local_68->mTransform).a4;
            (local_110->mTransformation).b4 =
                 (local_68->mTargetPosition).y - (local_68->mTransform).b4;
            (local_110->mTransformation).c4 =
                 (local_68->mTargetPosition).z - (local_68->mTransform).c4;
            local_110->mParent = (aiNode *)mParentAdjust._56_8_;
            for (local_134 = 0; local_134 < *(uint *)(mParentAdjust._56_8_ + 0x450);
                local_134 = local_134 + 1) {
              *(undefined8 *)(*(long *)(mParentAdjust._56_8_ + 0x458) + (ulong)(local_134 + 1) * 8)
                   = *(undefined8 *)(*(long *)(mParentAdjust._56_8_ + 0x458) + (ulong)local_134 * 8)
              ;
            }
            **(undefined8 **)(mParentAdjust._56_8_ + 0x458) = local_110;
            *(int *)(mParentAdjust._56_8_ + 0x450) = *(int *)(mParentAdjust._56_8_ + 0x450) + 1;
            this_01 = DefaultLogger::get();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_178,"ASE: Generating separate target node (",&local_68->mName);
            std::operator+(&local_158,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_178,")");
            Logger::debug(this_01,&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)local_178);
          }
        }
      }
    }
    else {
      sVar5 = std::__cxx11::string::length();
      if (local_190 == sVar5) {
        __s2 = (char *)std::__cxx11::string::c_str();
        iVar3 = strcmp(szName,__s2);
        if (iVar3 == 0) goto LAB_005b79dd;
      }
    }
    __gnu_cxx::
    __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

void ASEImporter::AddNodes (const std::vector<BaseNode*>& nodes,
    aiNode* pcParent, const char* szName,
    const aiMatrix4x4& mat)
{
    const size_t len = szName ? ::strlen(szName) : 0;
    ai_assert(4 <= AI_MAX_NUMBER_OF_COLOR_SETS);

    // Receives child nodes for the pcParent node
    std::vector<aiNode*> apcNodes;

    // Now iterate through all nodes in the scene and search for one
    // which has *us* as parent.
    for (std::vector<BaseNode*>::const_iterator it = nodes.begin(), end = nodes.end(); it != end; ++it) {
        const BaseNode* snode = *it;
        if (szName) {
            if (len != snode->mParent.length() || ::strcmp(szName,snode->mParent.c_str()))
                continue;
        }
        else if (snode->mParent.length())
            continue;

        (*it)->mProcessed = true;

        // Allocate a new node and add it to the output data structure
        apcNodes.push_back(new aiNode());
        aiNode* node = apcNodes.back();

        node->mName.Set((snode->mName.length() ? snode->mName.c_str() : "Unnamed_Node"));
        node->mParent = pcParent;

        // Setup the transformation matrix of the node
        aiMatrix4x4 mParentAdjust  = mat;
        mParentAdjust.Inverse();
        node->mTransformation = mParentAdjust*snode->mTransform;

        // Add sub nodes - prevent stack overflow due to recursive parenting
        if (node->mName != node->mParent->mName && node->mName != node->mParent->mParent->mName ) {
            AddNodes(nodes,node,node->mName.data,snode->mTransform);
        }

        // Further processing depends on the type of the node
        if (snode->mType == ASE::BaseNode::Mesh)    {
            // If the type of this node is "Mesh" we need to search
            // the list of output meshes in the data structure for
            // all those that belonged to this node once. This is
            // slightly inconvinient here and a better solution should
            // be used when this code is refactored next.
            AddMeshes(snode,node);
        }
        else if (is_not_qnan( snode->mTargetPosition.x ))   {
            // If this is a target camera or light we generate a small
            // child node which marks the position of the camera
            // target (the direction information is contained in *this*
            // node's animation track but the exact target position
            // would be lost otherwise)
            if (!node->mNumChildren)    {
                node->mChildren = new aiNode*[1];
            }

            aiNode* nd = new aiNode();

            nd->mName.Set ( snode->mName + ".Target" );

            nd->mTransformation.a4 = snode->mTargetPosition.x - snode->mTransform.a4;
            nd->mTransformation.b4 = snode->mTargetPosition.y - snode->mTransform.b4;
            nd->mTransformation.c4 = snode->mTargetPosition.z - snode->mTransform.c4;

            nd->mParent = node;

            // The .Target node is always the first child node
            for (unsigned int m = 0; m < node->mNumChildren;++m)
                node->mChildren[m+1] = node->mChildren[m];

            node->mChildren[0] = nd;
            node->mNumChildren++;

            // What we did is so great, it is at least worth a debug message
            ASSIMP_LOG_DEBUG("ASE: Generating separate target node ("+snode->mName+")");
        }
    }

    // Allocate enough space for the child nodes
    // We allocate one slot more  in case this is a target camera/light
    pcParent->mNumChildren = (unsigned int)apcNodes.size();
    if (pcParent->mNumChildren) {
        pcParent->mChildren = new aiNode*[apcNodes.size()+1 /* PLUS ONE !!! */];

        // now build all nodes for our nice new children
        for (unsigned int p = 0; p < apcNodes.size();++p)
            pcParent->mChildren[p] = apcNodes[p];
    }
    return;
}